

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

OPJ_BOOL opj_set_decoded_components
                   (opj_codec_t *p_codec,OPJ_UINT32 numcomps,OPJ_UINT32 *comps_indices,
                   OPJ_BOOL apply_color_transforms)

{
  opj_codec_private_t *l_codec;
  OPJ_BOOL apply_color_transforms_local;
  OPJ_UINT32 *comps_indices_local;
  OPJ_UINT32 numcomps_local;
  opj_codec_t *p_codec_local;
  
  if (p_codec == (opj_codec_t *)0x0) {
    p_codec_local._4_4_ = 0;
  }
  else if (*(int *)(p_codec + 0x12) == 0) {
    opj_event_msg((opj_event_mgr_t *)(p_codec + 0xc),1,
                  "Codec provided to the opj_set_decoded_components function is not a decompressor handler.\n"
                 );
    p_codec_local._4_4_ = 0;
  }
  else if (apply_color_transforms == 0) {
    p_codec_local._4_4_ = (*(code *)p_codec[10])(p_codec[0xb],numcomps,comps_indices,p_codec + 0xc);
  }
  else {
    opj_event_msg((opj_event_mgr_t *)(p_codec + 0xc),1,
                  "apply_color_transforms = OPJ_TRUE is not supported.\n");
    p_codec_local._4_4_ = 0;
  }
  return p_codec_local._4_4_;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_set_decoded_components(opj_codec_t *p_codec,
        OPJ_UINT32 numcomps,
        const OPJ_UINT32* comps_indices,
        OPJ_BOOL apply_color_transforms)
{
    if (p_codec) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;

        if (! l_codec->is_decompressor) {
            opj_event_msg(&(l_codec->m_event_mgr), EVT_ERROR,
                          "Codec provided to the opj_set_decoded_components function is not a decompressor handler.\n");
            return OPJ_FALSE;
        }

        if (apply_color_transforms) {
            opj_event_msg(&(l_codec->m_event_mgr), EVT_ERROR,
                          "apply_color_transforms = OPJ_TRUE is not supported.\n");
            return OPJ_FALSE;
        }

        return  l_codec->m_codec_data.m_decompression.opj_set_decoded_components(
                    l_codec->m_codec,
                    numcomps,
                    comps_indices,
                    &(l_codec->m_event_mgr));
    }
    return OPJ_FALSE;
}